

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation_engine.cpp
# Opt level: O1

void __thiscall cppurses::Animation_engine::startup(Animation_engine *this)

{
  pointer puVar1;
  unordered_map<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::hash<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::equal_to<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
  *__range1;
  unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  *loop;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  
  for (p_Var2 = (this->const_loops_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    Event_loop::run_async((Event_loop *)p_Var2[2]._M_nxt);
  }
  puVar1 = (this->variable_loops_).
           super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->variable_loops_).
                super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    Event_loop::run_async
              (&((puVar3->_M_t).
                 super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
                 .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl)->
                super_Event_loop);
  }
  return;
}

Assistant:

void Animation_engine::startup()
{
    for (auto& pair : const_loops_) {
        pair.second->run_async();
    }
    for (auto& loop : variable_loops_) {
        loop->run_async();
    }
}